

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBZR.cxx
# Opt level: O0

void __thiscall cmCTestBZR::cmCTestBZR(cmCTestBZR *this,cmCTest *ct,ostream *log)

{
  allocator<char> local_51;
  string local_50;
  ostream *local_20;
  ostream *log_local;
  cmCTest *ct_local;
  cmCTestBZR *this_local;
  
  local_20 = log;
  log_local = (ostream *)ct;
  ct_local = (cmCTest *)this;
  cmCTestGlobalVC::cmCTestGlobalVC(&this->super_cmCTestGlobalVC,ct,log);
  (this->super_cmCTestGlobalVC).super_cmCTestVC._vptr_cmCTestVC =
       (_func_int **)&PTR__cmCTestBZR_0166fb48;
  std::__cxx11::string::string((string *)&this->URL);
  cmCTestVC::Revision::operator=
            (&(this->super_cmCTestGlobalVC).PriorRev,
             &(this->super_cmCTestGlobalVC).super_cmCTestVC.Unknown);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"BZR_PROGRESS_BAR=none",&local_51);
  cmsys::SystemTools::PutEnv(&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  return;
}

Assistant:

cmCTestBZR::cmCTestBZR(cmCTest* ct, std::ostream& log)
  : cmCTestGlobalVC(ct, log)
{
  this->PriorRev = this->Unknown;
  // Even though it is specified in the documentation, with bzr 1.13
  // BZR_PROGRESS_BAR has no effect. In the future this bug might be fixed.
  // Since it doesn't hurt, we specify this environment variable.
  cmSystemTools::PutEnv("BZR_PROGRESS_BAR=none");
}